

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

int do_recip_sqrt_estimate(int a)

{
  int iVar1;
  int local_10;
  int estimate;
  int b;
  int a_local;
  
  if ((a < 0x80) || (0x1ff < a)) {
    __assert_fail("128 <= a && a < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                  ,0x35f,"int do_recip_sqrt_estimate(int)");
  }
  if (a < 0x100) {
    estimate = a * 2 + 1;
  }
  else {
    estimate = ((a >> 1) * 2 + 1) * 2;
  }
  for (local_10 = 0x200; estimate * (local_10 + 1) * (local_10 + 1) < 0x10000000;
      local_10 = local_10 + 1) {
  }
  iVar1 = (local_10 + 1) / 2;
  if ((0xff < iVar1) && (iVar1 < 0x200)) {
    return iVar1;
  }
  __assert_fail("256 <= estimate && estimate < 512",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                ,0x36b,"int do_recip_sqrt_estimate(int)");
}

Assistant:

static int do_recip_sqrt_estimate(int a)
{
    int b, estimate;

    assert(128 <= a && a < 512);
    if (a < 256) {
        a = a * 2 + 1;
    } else {
        a = (a >> 1) << 1;
        a = (a + 1) * 2;
    }
    b = 512;
    while (a * (b + 1) * (b + 1) < (1 << 28)) {
        b += 1;
    }
    estimate = (b + 1) / 2;
    assert(256 <= estimate && estimate < 512);

    return estimate;
}